

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O3

void TestRoundTrip(char *fn)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  Allocator AVar7;
  ulong uVar8;
  float *pfVar9;
  long lVar10;
  long lVar11;
  long *plVar12;
  char *pcVar13;
  ColorEncodingHandle *encoding;
  long *******ppppppplVar14;
  long lVar15;
  Point2i p;
  undefined1 auVar16 [16];
  Float FVar17;
  undefined1 in_ZMM2 [64];
  undefined1 in_register_000012c4 [12];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_float> values;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  float delta;
  AssertionResult gtest_ar__1;
  Point2i res;
  string filename;
  AssertionResult gtest_ar_;
  ImageChannelDesc rgbDesc;
  ImageAndMetadata readImage;
  Image image;
  AssertHelper local_498;
  AssertHelper local_490;
  float local_484;
  string local_480;
  Tuple2<pbrt::Point2,_int> local_460;
  long local_458;
  char *local_450;
  string local_448;
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  undefined1 local_3f8 [16];
  long *local_3e8 [2];
  long local_3d8 [2];
  undefined1 local_3c8 [16];
  ImageChannelDesc local_3b0;
  ulong local_380;
  undefined1 local_378 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_368;
  undefined1 *apuStack_358 [2];
  undefined1 auStack_348 [16];
  long ******local_338 [2];
  long *****appppplStack_328 [6];
  undefined1 auStack_2f8 [40];
  undefined1 local_2d0 [16];
  optional<float> oStack_2c0;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  aStack_2b8;
  size_t sStack_2b0;
  undefined1 auStack_2a8 [8];
  polymorphic_allocator<pbrt::Half> pStack_2a0;
  _Base_ptr p_Stack_298;
  _Base_ptr local_290;
  _Base_ptr local_288;
  polymorphic_allocator<float> local_280;
  float *local_278;
  size_t local_270;
  size_t local_268;
  bool local_25c;
  bool local_218;
  bool local_1d4;
  bool local_1c0;
  bool local_1b4;
  bool local_1ac;
  bool local_1a4;
  bool local_198;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_190;
  ColorEncodingHandle local_158;
  ColorEncodingHandle local_150;
  Image local_148;
  
  local_460.x = 0x10;
  local_460.y = 0x1d;
  local_378._0_8_ = local_378 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"R","");
  apuStack_358[0] = local_378 + 0x30;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_378 + 0x20),"G","");
  ppppppplVar14 = local_338 + 2;
  local_338[0] = (long ******)ppppppplVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"B","");
  encoding = &local_150;
  local_150.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  local_450 = fn;
  AVar7.memoryResource = pstd::pmr::new_delete_resource();
  channels.n = 3;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378;
  pbrt::Image::Image(&local_148,Float,(Point2i)0x1d00000010,channels,encoding,AVar7);
  lVar10 = -0x60;
  do {
    if (ppppppplVar14 != (long *******)ppppppplVar14[-2]) {
      operator_delete(ppppppplVar14[-2],(long)*ppppppplVar14 + 1);
    }
    ppppppplVar14 = ppppppplVar14 + -4;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0);
  if (0 < local_460.y) {
    uVar8 = (ulong)local_460 & 0xffffffff;
    lVar10 = 0;
    lVar15 = 0;
    iVar6 = local_460.y;
    do {
      if (0 < (int)uVar8) {
        local_3c8._0_4_ = (undefined4)(int)lVar15;
        local_3c8._4_12_ = in_register_000012c4;
        lVar11 = 0;
        do {
          auVar4 = vpinsrd_avx(ZEXT416((uint)uVar8),local_460.y,1);
          auVar16._0_4_ = (float)(int)lVar11;
          auVar16._4_12_ = in_register_000012c4;
          auVar3 = vinsertps_avx(auVar16,ZEXT416((uint)local_3c8._0_4_),0x10);
          auVar16 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
          in_ZMM2 = ZEXT1664(auVar16);
          auVar16 = vpaddd_avx(auVar4,auVar16);
          auVar16 = vcvtdq2ps_avx(auVar16);
          auVar16 = vdivps_avx(auVar3,auVar16);
          uVar2 = vmovlps_avx(auVar16);
          local_378._8_4_ = 0xbfc00000;
          local_378._0_8_ = uVar2;
          values.n = 3;
          values.ptr = (float *)local_378;
          pbrt::Image::SetChannels(&local_148,(Point2i)(lVar10 + lVar11),values);
          uVar8 = (ulong)local_460.x;
          lVar11 = lVar11 + 1;
        } while (lVar11 < (long)uVar8);
        iVar6 = local_460.y;
      }
      lVar15 = lVar15 + 1;
      lVar10 = lVar10 + 0x100000000;
    } while (lVar15 < iVar6);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_378,local_450,(allocator<char> *)local_428);
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_448,local_378._0_8_,(pointer)(local_378._8_8_ + local_378._0_8_));
  if (local_378._0_8_ != (long)local_378 + 0x10) {
    operator_delete((void *)local_378._0_8_,aStack_368._M_allocated_capacity + 1);
  }
  local_290 = (_Base_ptr)&pStack_2a0;
  _local_378 = ZEXT1664(ZEXT816(0) << 0x40);
  aStack_2b8 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                )0x0;
  sStack_2b0 = 0;
  auStack_2a8 = (undefined1  [8])0x0;
  pStack_2a0.memoryResource = (memory_resource *)0x0;
  p_Stack_298 = (_Base_ptr)0x0;
  auStack_2f8 = ZEXT1640(ZEXT816(0) << 0x40);
  local_2d0 = (undefined1  [16])0x0;
  oStack_2c0.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  oStack_2c0.set = false;
  oStack_2c0._5_3_ = 0;
  local_280.memoryResource = (memory_resource *)0x0;
  _local_338 = _local_378;
  local_288 = local_290;
  bVar5 = pbrt::Image::Write(&local_148,&local_448,(ImageMetadata *)local_378);
  local_428[0] = (allocator<char>)bVar5;
  local_428._8_8_ = (float *)0x0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)auStack_2a8);
  if (local_428[0] == (allocator<char>)0x0) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_378,(internal *)local_428,(AssertionResult *)"image.Write(filename)",
               "false","true",(char *)encoding);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_480,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x279,(char *)local_378._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_480,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_480);
    if (local_378._0_8_ != (long)local_378 + 0x10) {
      operator_delete((void *)local_378._0_8_,aStack_368._M_allocated_capacity + 1);
    }
    if ((((Tuple2<pbrt::Point2,_int>)local_3b0.offset.alloc.memoryResource !=
          (Tuple2<pbrt::Point2,_int>)0x0) && (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
       ((Tuple2<pbrt::Point2,_int>)local_3b0.offset.alloc.memoryResource !=
        (Tuple2<pbrt::Point2,_int>)0x0)) {
      (**(code **)(*(long *)local_3b0.offset.alloc.memoryResource + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_428 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_428 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    AVar7.memoryResource = pstd::pmr::new_delete_resource();
    local_158.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    pbrt::Image::Read((ImageAndMetadata *)local_378,&local_448,AVar7,&local_158);
    local_3b0.offset.alloc.memoryResource = (memory_resource *)local_378._4_8_;
    testing::internal::CmpHelperEQ<pbrt::Point2<int>,pbrt::Point2<int>>
              ((internal *)local_428,"readImage.image.Resolution()","res",(Point2<int> *)&local_3b0,
               (Point2<int> *)&local_460);
    if (local_428[0] == (allocator<char>)0x0) {
      testing::Message::Message((Message *)&local_3b0);
      if ((float *)local_428._8_8_ == (float *)0x0) {
        pcVar13 = "";
      }
      else {
        pcVar13 = *(char **)local_428._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_480,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x27c,pcVar13);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_480,(Message *)&local_3b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_480);
      if ((((Tuple2<pbrt::Point2,_int>)local_3b0.offset.alloc.memoryResource !=
            (Tuple2<pbrt::Point2,_int>)0x0) && (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
         ((Tuple2<pbrt::Point2,_int>)local_3b0.offset.alloc.memoryResource !=
          (Tuple2<pbrt::Point2,_int>)0x0)) {
        (**(code **)(*(long *)local_3b0.offset.alloc.memoryResource + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_428 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_428 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_428._0_8_ = local_428 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"R","");
      local_408._M_allocated_capacity = (size_type)local_3f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"G","");
      plVar12 = local_3d8;
      local_3e8[0] = plVar12;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"B","");
      requestedChannels.n = 3;
      requestedChannels.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_428;
      pbrt::Image::GetChannelDesc(&local_3b0,(Image *)local_378,requestedChannels);
      lVar10 = -0x60;
      do {
        if (plVar12 != (long *)plVar12[-2]) {
          operator_delete((long *)plVar12[-2],*plVar12 + 1);
        }
        plVar12 = plVar12 + -4;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0);
      local_480._M_dataplus._M_p._0_1_ = local_3b0.offset.nStored != 0;
      local_480._M_string_length = 0;
      if (local_3b0.offset.nStored == 0) {
        testing::Message::Message((Message *)&local_498);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_428,(internal *)&local_480,(AssertionResult *)"(bool)rgbDesc",
                   "false","true",(char *)encoding);
        testing::internal::AssertHelper::AssertHelper
                  (&local_490,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                   ,0x27f,(char *)local_428._0_8_);
        testing::internal::AssertHelper::operator=(&local_490,(Message *)&local_498);
        testing::internal::AssertHelper::~AssertHelper(&local_490);
        if ((undefined1 *)local_428._0_8_ != local_428 + 0x10) {
          operator_delete((void *)local_428._0_8_,local_418._0_8_ + 1);
        }
        if (((local_498.data_ != (AssertHelperData *)0x0) &&
            (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
           (local_498.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_498.data_ + 8))();
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_480._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_480._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (0 < local_460.y) {
          uVar8 = (ulong)local_460 & 0xffffffff;
          paVar1 = &local_480.field_2;
          local_458 = 0;
          iVar6 = local_460.y;
          do {
            if (0 < (int)uVar8) {
              local_380 = local_458 << 0x20;
              pcVar13 = (char *)0x0;
              do {
                p.super_Tuple2<pbrt::Point2,_int> =
                     (Tuple2<pbrt::Point2,_int>)(local_380 | (ulong)pcVar13);
                local_450 = pcVar13;
                pbrt::Image::GetChannels
                          ((ImageChannelValues *)local_428,(Image *)local_378,p,&local_3b0,
                           (WrapMode2D)0x200000002);
                lVar10 = 0;
                do {
                  iVar6 = (int)lVar10;
                  FVar17 = pbrt::Image::GetChannel(&local_148,p,iVar6,(WrapMode2D)0x200000002);
                  local_3c8._0_4_ = FVar17;
                  pfVar9 = (float *)local_428._8_8_;
                  if ((float *)local_428._8_8_ == (float *)0x0) {
                    pfVar9 = (float *)(local_428 + 0x10);
                  }
                  local_484 = FVar17 - pfVar9[lVar10];
                  local_480._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"pfm","");
                  bVar5 = pbrt::HasExtension(&local_448,&local_480);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_480._M_dataplus._M_p != paVar1) {
                    operator_delete(local_480._M_dataplus._M_p,
                                    local_480.field_2._M_allocated_capacity + 1);
                  }
                  if (bVar5) {
                    local_498.data_ = local_498.data_ & 0xffffffff00000000;
                    testing::internal::CmpHelperEQ<int,float>
                              ((internal *)&local_480,"0","delta",(int *)&local_498,&local_484);
                    if ((char)local_480._M_dataplus._M_p == '\0') {
                      testing::Message::Message((Message *)&local_498);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&(local_498.data_)->line,local_448._M_dataplus._M_p,
                                 local_448._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&(local_498.data_)->line,":(",2);
                      std::ostream::operator<<((ostream *)&(local_498.data_)->line,(int)local_450);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&(local_498.data_)->line,", ",2);
                      std::ostream::operator<<((ostream *)&(local_498.data_)->line,(int)local_458);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&(local_498.data_)->line,") c = ",6);
                      std::ostream::operator<<((ostream *)&(local_498.data_)->line,iVar6);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&(local_498.data_)->line," wrote ",7);
                      std::ostream::_M_insert<double>((double)(float)local_3c8._0_4_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&(local_498.data_)->line,", read ",7);
                      pfVar9 = (float *)local_428._8_8_;
                      if ((float *)local_428._8_8_ == (float *)0x0) {
                        pfVar9 = (float *)(local_428 + 0x10);
                      }
                      std::ostream::_M_insert<double>((double)pfVar9[lVar10]);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&(local_498.data_)->line,", delta = ",10);
                      std::ostream::_M_insert<double>((double)local_484);
                      pcVar13 = "";
                      if ((undefined8 *)local_480._M_string_length != (undefined8 *)0x0) {
                        pcVar13 = *(char **)local_480._M_string_length;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_490,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                                 ,0x28a,pcVar13);
                      testing::internal::AssertHelper::operator=(&local_490,(Message *)&local_498);
                      testing::internal::AssertHelper::~AssertHelper(&local_490);
                      if (((local_498.data_ != (AssertHelperData *)0x0) &&
                          (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
                         (local_498.data_ != (AssertHelperData *)0x0)) {
                        (**(code **)(*(long *)local_498.data_ + 8))();
                      }
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_480._M_string_length,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                  }
                  else {
                    local_480._M_dataplus._M_p = (pointer)paVar1;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"exr","");
                    bVar5 = pbrt::HasExtension(&local_448,&local_480);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_480._M_dataplus._M_p != paVar1) {
                      operator_delete(local_480._M_dataplus._M_p,
                                      local_480.field_2._M_allocated_capacity + 1);
                    }
                    if (bVar5) {
                      if (lVar10 == 2) {
                        local_498.data_ = (AssertHelperData *)((ulong)local_498.data_._4_4_ << 0x20)
                        ;
                        testing::internal::CmpHelperEQ<int,float>
                                  ((internal *)&local_480,"0","delta",(int *)&local_498,&local_484);
                        if ((char)local_480._M_dataplus._M_p == '\0') {
                          testing::Message::Message((Message *)&local_498);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_498.data_)->line,"(",1);
                          std::ostream::operator<<
                                    ((ostream *)&(local_498.data_)->line,(int)local_450);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_498.data_)->line,", ",2);
                          std::ostream::operator<<
                                    ((ostream *)&(local_498.data_)->line,(int)local_458);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_498.data_)->line,") c = ",6);
                          std::ostream::operator<<((ostream *)&(local_498.data_)->line,2);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_498.data_)->line," wrote ",7);
                          std::ostream::_M_insert<double>((double)(float)local_3c8._0_4_);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_498.data_)->line,", read ",7);
                          pfVar9 = (float *)(local_428._8_8_ + 8);
                          if ((float *)local_428._8_8_ == (float *)0x0) {
                            pfVar9 = (float *)(local_418 + 8);
                          }
                          std::ostream::_M_insert<double>((double)*pfVar9);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_498.data_)->line,", delta = ",10);
                          std::ostream::_M_insert<double>((double)local_484);
                          pcVar13 = "";
                          if ((undefined8 *)local_480._M_string_length != (undefined8 *)0x0) {
                            pcVar13 = *(char **)local_480._M_string_length;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_490,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                                     ,0x290,pcVar13);
                          testing::internal::AssertHelper::operator=
                                    (&local_490,(Message *)&local_498);
                          testing::internal::AssertHelper::~AssertHelper(&local_490);
                          if (((local_498.data_ != (AssertHelperData *)0x0) &&
                              (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
                             (local_498.data_ != (AssertHelperData *)0x0)) {
                            (**(code **)(*(long *)local_498.data_ + 8))();
                          }
                        }
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&local_480._M_string_length,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0);
                        break;
                      }
                      auVar4._8_4_ = 0x7fffffff;
                      auVar4._0_8_ = 0x7fffffff7fffffff;
                      auVar4._12_4_ = 0x7fffffff;
                      auVar16 = vandps_avx512vl(ZEXT416((uint)local_484),auVar4);
                      local_498.data_ = (AssertHelperData *)&DAT_3f50624dd2f1a9fc;
                      local_490.data_._0_4_ = auVar16._0_4_;
                      testing::internal::CmpHelperLT<float,double>
                                ((internal *)&local_480,"std::abs(delta)",".001",(float *)&local_490
                                 ,(double *)&local_498);
                      if ((char)local_480._M_dataplus._M_p == '\0') {
                        testing::Message::Message((Message *)&local_498);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line,local_448._M_dataplus._M_p,
                                   local_448._M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line,":(",2);
                        std::ostream::operator<<((ostream *)&(local_498.data_)->line,(int)local_450)
                        ;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line,", ",2);
                        std::ostream::operator<<((ostream *)&(local_498.data_)->line,(int)local_458)
                        ;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line,") c = ",6);
                        std::ostream::operator<<((ostream *)&(local_498.data_)->line,iVar6);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line," wrote ",7);
                        std::ostream::_M_insert<double>((double)(float)local_3c8._0_4_);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line,", read ",7);
                        pfVar9 = (float *)local_428._8_8_;
                        if ((float *)local_428._8_8_ == (float *)0x0) {
                          pfVar9 = (float *)(local_428 + 0x10);
                        }
                        std::ostream::_M_insert<double>((double)pfVar9[lVar10]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line,", delta = ",10);
                        std::ostream::_M_insert<double>((double)local_484);
                        pcVar13 = "";
                        if ((undefined8 *)local_480._M_string_length != (undefined8 *)0x0) {
                          pcVar13 = *(char **)local_480._M_string_length;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_490,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                                   ,0x294,pcVar13);
                        testing::internal::AssertHelper::operator=(&local_490,(Message *)&local_498)
                        ;
                        testing::internal::AssertHelper::~AssertHelper(&local_490);
                        if (((local_498.data_ != (AssertHelperData *)0x0) &&
                            (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
                           (local_498.data_ != (AssertHelperData *)0x0)) {
                          (**(code **)(*(long *)local_498.data_ + 8))();
                        }
                      }
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_480._M_string_length,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0);
                    }
                    else {
                      if (lVar10 == 2) {
                        local_498.data_ = (AssertHelperData *)((ulong)local_498.data_._4_4_ << 0x20)
                        ;
                        pfVar9 = (float *)(local_428._8_8_ + 8);
                        if ((float *)local_428._8_8_ == (float *)0x0) {
                          pfVar9 = (float *)(local_418 + 8);
                        }
                        testing::internal::CmpHelperEQ<int,float>
                                  ((internal *)&local_480,"0","rgb[c]",(int *)&local_498,pfVar9);
                        if ((char)local_480._M_dataplus._M_p == '\0') {
                          testing::Message::Message((Message *)&local_498);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_498.data_)->line,"(",1);
                          std::ostream::operator<<
                                    ((ostream *)&(local_498.data_)->line,(int)local_450);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_498.data_)->line,", ",2);
                          std::ostream::operator<<
                                    ((ostream *)&(local_498.data_)->line,(int)local_458);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_498.data_)->line,") c = ",6);
                          std::ostream::operator<<((ostream *)&(local_498.data_)->line,2);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_498.data_)->line," wrote ",7);
                          std::ostream::_M_insert<double>((double)(float)local_3c8._0_4_);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_498.data_)->line,", read ",7);
                          pfVar9 = (float *)(local_428._8_8_ + 8);
                          if ((float *)local_428._8_8_ == (float *)0x0) {
                            pfVar9 = (float *)(local_418 + 8);
                          }
                          std::ostream::_M_insert<double>((double)*pfVar9);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_498.data_)->line," (expected 0 back)",0x12);
                          pcVar13 = "";
                          if ((undefined8 *)local_480._M_string_length != (undefined8 *)0x0) {
                            pcVar13 = *(char **)local_480._M_string_length;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_490,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                                     ,0x29c,pcVar13);
                          testing::internal::AssertHelper::operator=
                                    (&local_490,(Message *)&local_498);
                          testing::internal::AssertHelper::~AssertHelper(&local_490);
                          if (((local_498.data_ != (AssertHelperData *)0x0) &&
                              (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
                             (local_498.data_ != (AssertHelperData *)0x0)) {
                            (**(code **)(*(long *)local_498.data_ + 8))();
                          }
                        }
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&local_480._M_string_length,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0);
                        break;
                      }
                      auVar3._8_4_ = 0x7fffffff;
                      auVar3._0_8_ = 0x7fffffff7fffffff;
                      auVar3._12_4_ = 0x7fffffff;
                      auVar16 = vandps_avx512vl(ZEXT416((uint)local_484),auVar3);
                      local_498.data_ = (AssertHelperData *)&DAT_3f947ae147ae147b;
                      local_490.data_._0_4_ = auVar16._0_4_;
                      testing::internal::CmpHelperLT<float,double>
                                ((internal *)&local_480,"std::abs(delta)",".02",(float *)&local_490,
                                 (double *)&local_498);
                      if ((char)local_480._M_dataplus._M_p == '\0') {
                        testing::Message::Message((Message *)&local_498);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line,local_448._M_dataplus._M_p,
                                   local_448._M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line,":(",2);
                        std::ostream::operator<<((ostream *)&(local_498.data_)->line,(int)local_450)
                        ;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line,", ",2);
                        std::ostream::operator<<((ostream *)&(local_498.data_)->line,(int)local_458)
                        ;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line,") c = ",6);
                        std::ostream::operator<<((ostream *)&(local_498.data_)->line,iVar6);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line," wrote ",7);
                        std::ostream::_M_insert<double>((double)(float)local_3c8._0_4_);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line,", read ",7);
                        pfVar9 = (float *)local_428._8_8_;
                        if ((float *)local_428._8_8_ == (float *)0x0) {
                          pfVar9 = (float *)(local_428 + 0x10);
                        }
                        std::ostream::_M_insert<double>((double)pfVar9[lVar10]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line,", delta = ",10);
                        std::ostream::_M_insert<double>((double)local_484);
                        pcVar13 = "";
                        if ((undefined8 *)local_480._M_string_length != (undefined8 *)0x0) {
                          pcVar13 = *(char **)local_480._M_string_length;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_490,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                                   ,0x2a2,pcVar13);
                        testing::internal::AssertHelper::operator=(&local_490,(Message *)&local_498)
                        ;
                        testing::internal::AssertHelper::~AssertHelper(&local_490);
                        if (((local_498.data_ != (AssertHelperData *)0x0) &&
                            (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
                           (local_498.data_ != (AssertHelperData *)0x0)) {
                          (**(code **)(*(long *)local_498.data_ + 8))();
                        }
                      }
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_480._M_string_length,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0);
                    }
                  }
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 3);
                local_408._8_8_ = 0;
                (**(code **)(*(long *)local_428._0_8_ + 0x18))
                          (local_428._0_8_,local_428._8_8_,local_408._M_allocated_capacity << 2,4);
                uVar8 = (ulong)local_460.x;
                pcVar13 = local_450 + 1;
              } while ((long)pcVar13 < (long)uVar8);
              iVar6 = local_460.y;
            }
            local_458 = local_458 + 1;
          } while (local_458 < iVar6);
        }
        local_480._M_dataplus._M_p = local_480._M_dataplus._M_p & 0xffffffff00000000;
        iVar6 = remove(local_448._M_dataplus._M_p);
        local_498.data_._0_4_ = iVar6;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_428,"0","remove(filename.c_str())",(int *)&local_480,
                   (int *)&local_498);
        if (local_428[0] == (allocator<char>)0x0) {
          testing::Message::Message((Message *)&local_480);
          if ((float *)local_428._8_8_ == (float *)0x0) {
            pcVar13 = "";
          }
          else {
            pcVar13 = *(char **)local_428._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_498,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x2ab,pcVar13);
          testing::internal::AssertHelper::operator=(&local_498,(Message *)&local_480);
          testing::internal::AssertHelper::~AssertHelper(&local_498);
          if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) && (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0)) {
            (**(code **)(*(size_type *)local_480._M_dataplus._M_p + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_428 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      local_3b0.offset.nStored = 0;
      (**(code **)(*(long *)local_3b0.offset.alloc.memoryResource + 0x18))
                (local_3b0.offset.alloc.memoryResource,local_3b0.offset.ptr,
                 local_3b0.offset.nAlloc << 2,4);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&local_190);
    if (local_198 == true) {
      local_198 = false;
    }
    if (local_1a4 == true) {
      local_1a4 = false;
    }
    if (local_1ac == true) {
      local_1ac = false;
    }
    if (local_1b4 == true) {
      local_1b4 = false;
    }
    if (local_1c0 == true) {
      local_1c0 = false;
    }
    if (local_1d4 == true) {
      local_1d4 = false;
    }
    if (local_218 == true) {
      local_218 = false;
    }
    if (local_25c == true) {
      local_25c = false;
    }
    local_268 = 0;
    (*(local_280.memoryResource)->_vptr_memory_resource[3])
              (local_280.memoryResource,local_278,local_270 << 2,4);
    local_288 = (_Base_ptr)0x0;
    (*(pStack_2a0.memoryResource)->_vptr_memory_resource[3])
              (pStack_2a0.memoryResource,p_Stack_298,(long)local_290 * 2,2);
    auStack_2a8 = (undefined1  [8])0x0;
    (**(code **)(*(long *)oStack_2c0 + 0x18))(oStack_2c0,aStack_2b8,sStack_2b0,1);
    pbrt::
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_378 + 0x10));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_148.p32.nStored = 0;
  (*(local_148.p32.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p32.alloc.memoryResource,local_148.p32.ptr,local_148.p32.nAlloc << 2,4);
  local_148.p16.nStored = 0;
  (*(local_148.p16.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p16.alloc.memoryResource,local_148.p16.ptr,local_148.p16.nAlloc * 2,2);
  local_148.p8.nStored = 0;
  (*(local_148.p8.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p8.alloc.memoryResource,local_148.p8.ptr,local_148.p8.nAlloc,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector(&local_148.channelNames);
  return;
}

Assistant:

static void TestRoundTrip(const char *fn) {
    Point2i res(16, 29);
    Image image(PixelFormat::Float, res, {"R", "G", "B"});
    for (int y = 0; y < res[1]; ++y)
        for (int x = 0; x < res[0]; ++x)
            image.SetChannels({x, y}, {Float(x) / Float(res[0] - 1),
                                       Float(y) / Float(res[1] - 1), Float(-1.5)});

    std::string filename = inTestDir(fn);
    ASSERT_TRUE(image.Write(filename));

    ImageAndMetadata readImage = Image::Read(filename);
    ASSERT_EQ(readImage.image.Resolution(), res);

    ImageChannelDesc rgbDesc = readImage.image.GetChannelDesc({"R", "G", "B"});
    ASSERT_TRUE((bool)rgbDesc);

    for (int y = 0; y < res[1]; ++y)
        for (int x = 0; x < res[0]; ++x) {
            ImageChannelValues rgb = readImage.image.GetChannels({x, y}, rgbDesc);

            for (int c = 0; c < 3; ++c) {
                float wrote = image.GetChannel({x, y}, c);
                float delta = wrote - rgb[c];
                if (HasExtension(filename, "pfm")) {
                    // Everything should come out exact.
                    EXPECT_EQ(0, delta) << filename << ":(" << x << ", " << y
                                        << ") c = " << c << " wrote " << wrote
                                        << ", read " << rgb[c] << ", delta = " << delta;
                } else if (HasExtension(filename, "exr")) {
                    if (c == 2)
                        // -1.5 is exactly representable as a float.
                        EXPECT_EQ(0, delta)
                            << "(" << x << ", " << y << ") c = " << c << " wrote "
                            << wrote << ", read " << rgb[c] << ", delta = " << delta;
                    else
                        EXPECT_LT(std::abs(delta), .001)
                            << filename << ":(" << x << ", " << y << ") c = " << c
                            << " wrote " << wrote << ", read " << rgb[c]
                            << ", delta = " << delta;
                } else {
                    // 8 bit format...
                    if (c == 2)
                        // -1.5 should be clamped to zero.
                        EXPECT_EQ(0, rgb[c])
                            << "(" << x << ", " << y << ") c = " << c << " wrote "
                            << wrote << ", read " << rgb[c] << " (expected 0 back)";
                    else
                        // Allow a fair amount of slop, since there's an sRGB
                        // conversion before quantization to 8-bits...
                        EXPECT_LT(std::abs(delta), .02)
                            << filename << ":(" << x << ", " << y << ") c = " << c
                            << " wrote " << wrote << ", read " << rgb[c]
                            << ", delta = " << delta;
                }
            }
        }

    // Clean up
    EXPECT_EQ(0, remove(filename.c_str()));
}